

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_decomposition.cpp
# Opt level: O2

void qRDecomposition(MatrixXd *A,MatrixXd *Q,MatrixXd *R)

{
  double *__ptr;
  Index IVar1;
  Index IVar2;
  MatrixXd thinQ;
  MatrixXd q;
  HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> householderQR;
  Matrix<double,__1,__1,_0,__1,__1> local_d8;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_c0;
  void *local_98 [3];
  HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_80;
  Type local_40;
  
  local_80.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)
       (A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  local_c0.m_rhs = local_c0.m_lhs.m_matrix;
  local_c0.m_lhs.m_matrix =
       (non_const_type)
       (A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<long,long>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_d8,(long *)&local_80,(long *)&local_c0);
  local_80.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)
       (A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  local_c0.m_lhs.m_matrix =
       (non_const_type)
       local_80.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<long,long>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_98,(long *)&local_80,(long *)&local_c0);
  Eigen::HouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  HouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((HouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_80,
             (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)A);
  Eigen::HouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::householderQ
            ((HouseholderSequenceType *)&local_c0,&local_80);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator=
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_98,
             (EigenBase<Eigen::HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>
              *)&local_c0);
  Eigen::internal::setIdentity_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>::run(&local_d8)
  ;
  Eigen::HouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::householderQ
            ((HouseholderSequenceType *)&local_c0,&local_80);
  Eigen::
  HouseholderSequence<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,1>::
  operator*(&local_40,
            (HouseholderSequence<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,1>
             *)&local_c0,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_d8);
  __ptr = (Q->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  (Q->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data =
       local_40.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
  IVar1 = (Q->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  IVar2 = (Q->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  (Q->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows =
       local_40.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
  (Q->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols =
       local_40.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
  local_40.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data = __ptr
  ;
  local_40.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = IVar1
  ;
  local_40.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = IVar2
  ;
  free(__ptr);
  local_40.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)Q;
  local_c0 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::operator*
                       ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>> *)
                        &local_40,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)A);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
            (R,&local_c0);
  Eigen::HouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~HouseholderQR(&local_80);
  free(local_98[0]);
  free(local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return;
}

Assistant:

void qRDecomposition(Eigen::MatrixXd &A,Eigen::MatrixXd &Q, Eigen::MatrixXd &R)
{
    /*
        A=QR
        Q: is orthogonal matrix-> columns of Q are orthonormal
        R: is upper triangulate matrix
        this is possible when columns of A are linearly indipendent
    */

    Eigen::MatrixXd thinQ(A.rows(),A.cols() ), q(A.rows(),A.rows());

    Eigen::HouseholderQR<Eigen::MatrixXd> householderQR(A);
    q = householderQR.householderQ();
    thinQ.setIdentity();
    Q = householderQR.householderQ() * thinQ;
    R=Q.transpose()*A;
}